

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
          (MutableCodePointTrie *this,uint32_t iniValue,uint32_t errValue,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t *puVar2;
  UErrorCode *errorCode_local;
  uint32_t errValue_local;
  uint32_t iniValue_local;
  MutableCodePointTrie *this_local;
  
  this->index = (uint32_t *)0x0;
  this->indexCapacity = 0;
  this->index3NullOffset = -1;
  this->data = (uint32_t *)0x0;
  this->dataCapacity = 0;
  this->dataLength = 0;
  this->dataNullOffset = -1;
  this->origInitialValue = iniValue;
  this->initialValue = iniValue;
  this->errorValue = errValue;
  this->highStart = 0;
  this->highValue = this->initialValue;
  this->index16 = (uint16_t *)0x0;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    puVar2 = (uint32_t *)uprv_malloc_63(0x4000);
    this->index = puVar2;
    puVar2 = (uint32_t *)uprv_malloc_63(0x10000);
    this->data = puVar2;
    if ((this->index == (uint32_t *)0x0) || (this->data == (uint32_t *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->indexCapacity = 0x1000;
      this->dataCapacity = 0x4000;
    }
  }
  return;
}

Assistant:

MutableCodePointTrie::MutableCodePointTrie(uint32_t iniValue, uint32_t errValue, UErrorCode &errorCode) :
        origInitialValue(iniValue), initialValue(iniValue), errorValue(errValue),
        highStart(0), highValue(initialValue)
#ifdef UCPTRIE_DEBUG
        , name("open")
#endif
        {
    if (U_FAILURE(errorCode)) { return; }
    index = (uint32_t *)uprv_malloc(BMP_I_LIMIT * 4);
    data = (uint32_t *)uprv_malloc(INITIAL_DATA_LENGTH * 4);
    if (index == nullptr || data == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    indexCapacity = BMP_I_LIMIT;
    dataCapacity = INITIAL_DATA_LENGTH;
}